

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void anon_unknown.dwarf_10310e3::blend_a64_hmask_ref
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  uint32_t in_ECX;
  uint8_t *in_RDX;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  uint32_t in_R9D;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int col;
  int row;
  uint8_t mask2d [256] [256];
  int iStack_10040;
  int iStack_1003c;
  uint8_t auStack_10038 [65584];
  
  for (iStack_1003c = 0; iStack_1003c < in_stack_00000018; iStack_1003c = iStack_1003c + 1) {
    for (iStack_10040 = 0; iStack_10040 < in_stack_00000010; iStack_10040 = iStack_10040 + 1) {
      auStack_10038[(long)iStack_10040 + (long)iStack_1003c * 0x100] =
           *(uint8_t *)(in_stack_00000008 + iStack_10040);
    }
  }
  aom_blend_a64_mask_c
            (in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,auStack_10038,0x100,in_stack_00000010,
             in_stack_00000018,0,0);
  return;
}

Assistant:

static void blend_a64_hmask_ref(uint8_t *dst, uint32_t dst_stride,
                                const uint8_t *src0, uint32_t src0_stride,
                                const uint8_t *src1, uint32_t src1_stride,
                                const uint8_t *mask, int w, int h) {
  uint8_t mask2d[BlendA64Mask1DTest8B::kMaxMaskSize]
                [BlendA64Mask1DTest8B::kMaxMaskSize];

  for (int row = 0; row < h; ++row)
    for (int col = 0; col < w; ++col) mask2d[row][col] = mask[col];

  aom_blend_a64_mask_c(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                       &mask2d[0][0], BlendA64Mask1DTest8B::kMaxMaskSize, w, h,
                       0, 0);
}